

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O0

int match_class(int c,int cl)

{
  int iVar1;
  ushort **ppuVar2;
  uint local_24;
  uint local_18;
  int res;
  int cl_local;
  int c_local;
  
  iVar1 = tolower(cl);
  switch(iVar1) {
  case 0x61:
    ppuVar2 = __ctype_b_loc();
    local_18 = (*ppuVar2)[c] & 0x400;
    break;
  default:
    return (uint)(cl == c);
  case 99:
    ppuVar2 = __ctype_b_loc();
    local_18 = (*ppuVar2)[c] & 2;
    break;
  case 100:
    ppuVar2 = __ctype_b_loc();
    local_18 = (*ppuVar2)[c] & 0x800;
    break;
  case 0x6c:
    ppuVar2 = __ctype_b_loc();
    local_18 = (*ppuVar2)[c] & 0x200;
    break;
  case 0x70:
    ppuVar2 = __ctype_b_loc();
    local_18 = (*ppuVar2)[c] & 4;
    break;
  case 0x73:
    ppuVar2 = __ctype_b_loc();
    local_18 = (*ppuVar2)[c] & 0x2000;
    break;
  case 0x75:
    ppuVar2 = __ctype_b_loc();
    local_18 = (*ppuVar2)[c] & 0x100;
    break;
  case 0x77:
    ppuVar2 = __ctype_b_loc();
    local_18 = (*ppuVar2)[c] & 8;
    break;
  case 0x78:
    ppuVar2 = __ctype_b_loc();
    local_18 = (*ppuVar2)[c] & 0x1000;
    break;
  case 0x7a:
    local_18 = (uint)(c == 0);
  }
  ppuVar2 = __ctype_b_loc();
  if (((*ppuVar2)[cl] & 0x200) == 0) {
    local_24 = (uint)((local_18 != 0 ^ 0xffU) & 1);
  }
  else {
    local_24 = local_18;
  }
  return local_24;
}

Assistant:

static int match_class (int c, int cl) {
  int res;
  switch (tolower(cl)) {
    case 'a' : res = isalpha(c); break;
    case 'c' : res = iscntrl(c); break;
    case 'd' : res = isdigit(c); break;
    case 'l' : res = islower(c); break;
    case 'p' : res = ispunct(c); break;
    case 's' : res = isspace(c); break;
    case 'u' : res = isupper(c); break;
    case 'w' : res = isalnum(c); break;
    case 'x' : res = isxdigit(c); break;
    case 'z' : res = (c == 0); break;
    default: return (cl == c);
  }
  return (islower(cl) ? res : !res);
}